

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall CaDiCaL::Solver::section(Solver *this,char *title)

{
  char *__ptr;
  
  if (this->_state == DELETING) {
    return;
  }
  require_solver_pointer_to_be_non_zero
            (this,"void CaDiCaL::Solver::section(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::section(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
  }
  else {
    if (this->internal != (Internal *)0x0) {
      Internal::section(this->internal,title);
      return;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::section(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "internal solver not initialized";
  }
  fwrite(__ptr,0x1f,1,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

void Solver::section (const char *title) {
  if (state () == DELETING)
    return;
#ifdef QUIET
  (void) title;
#endif
  REQUIRE_INITIALIZED ();
  SECTION (title);
}